

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::to_buffer_size_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  bool bVar1;
  long lVar2;
  SPIRVariable *var;
  undefined8 *puVar3;
  long *plVar4;
  runtime_error *this_00;
  size_type *psVar5;
  ulong uVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  long local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  CompilerGLSL::to_expression_abi_cxx11_(&local_c8,&this->super_CompilerGLSL,id,true);
  lVar2 = ::std::__cxx11::string::find((char)&local_c8,0x5b);
  if (((2 < local_c8._M_string_length) && (*local_c8._M_dataplus._M_p == '(')) &&
     (local_c8._M_dataplus._M_p[1] == '*')) {
    CompilerGLSL::address_of_expression(&local_88,&this->super_CompilerGLSL,&local_c8);
    ::std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  if (local_c8._M_string_length != 0) {
    uVar6 = 0;
    do {
      if (local_c8._M_dataplus._M_p[uVar6] == '.') {
        local_c8._M_dataplus._M_p[uVar6] = '_';
      }
      uVar6 = uVar6 + 1;
    } while (local_c8._M_string_length != uVar6);
  }
  if (lVar2 == -1) {
    ::std::operator+(__return_storage_ptr__,&local_c8,&this->buffer_size_name_suffix);
    goto LAB_001dc5a0;
  }
  ::std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_c8);
  ::std::__cxx11::string::substr((ulong)local_48,(ulong)&local_c8);
  var = Compiler::maybe_get_backing_variable((Compiler *)this,id);
  if ((var == (SPIRVariable *)0x0) || (bVar1 = is_var_runtime_size_array(this,var), !bVar1)) {
LAB_001dc4dd:
    ::std::operator+(&local_e8,&local_88,&this->buffer_size_name_suffix);
    plVar4 = (long *)::std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_48[0]);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    _Var8._M_p = local_e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
LAB_001dc572:
      operator_delete(_Var8._M_p);
    }
  }
  else {
    if ((this->msl_options).runtime_array_rich_descriptor == false) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"OpArrayLength requires rich descriptor format");
      *(undefined ***)this_00 = &PTR__runtime_error_003a8f30;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    lVar2 = ::std::__cxx11::string::rfind((char)local_48,0x5d);
    if (lVar2 == -1) goto LAB_001dc4dd;
    local_a8 = &local_98;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    ::std::__cxx11::string::append((char *)&local_a8);
    ::std::__cxx11::string::substr((ulong)&local_68,(ulong)local_48);
    uVar7 = 0xf;
    if (local_a8 != &local_98) {
      uVar7 = local_98._M_allocated_capacity;
    }
    if ((ulong)uVar7 < (ulong)(local_60 + local_a0)) {
      uVar6 = 0xf;
      if (local_68 != local_58) {
        uVar6 = local_58[0];
      }
      if (uVar6 < (ulong)(local_60 + local_a0)) goto LAB_001dc4c6;
      puVar3 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_a8);
    }
    else {
LAB_001dc4c6:
      puVar3 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68);
    }
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    psVar5 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8.field_2._8_8_ = puVar3[3];
    }
    else {
      local_e8.field_2._M_allocated_capacity = *psVar5;
      local_e8._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_e8._M_string_length = puVar3[1];
    *puVar3 = psVar5;
    puVar3[1] = 0;
    *(undefined1 *)psVar5 = 0;
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_e8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
    _Var8._M_p = (pointer)local_a8;
    if (local_a8 != &local_98) goto LAB_001dc572;
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
LAB_001dc5a0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_buffer_size_expression(uint32_t id)
{
	auto expr = to_expression(id);
	auto index = expr.find_first_of('[');

	// This is quite crude, but we need to translate the reference name (*spvDescriptorSetN.name) to
	// the pointer expression spvDescriptorSetN.name to make a reasonable expression here.
	// This only happens if we have argument buffers and we are using OpArrayLength on a lone SSBO in that set.
	if (expr.size() >= 3 && expr[0] == '(' && expr[1] == '*')
		expr = address_of_expression(expr);

	// If a buffer is part of an argument buffer translate this to a legal identifier.
	for (auto &c : expr)
		if (c == '.')
			c = '_';

	if (index == string::npos)
		return expr + buffer_size_name_suffix;
	else
	{
		auto buffer_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		if (auto var = maybe_get_backing_variable(id))
		{
			if (is_var_runtime_size_array(*var))
			{
				if (!msl_options.runtime_array_rich_descriptor)
					SPIRV_CROSS_THROW("OpArrayLength requires rich descriptor format");

				auto last_pos = array_expr.find_last_of(']');
				if (last_pos != std::string::npos)
					return buffer_expr + ".length(" + array_expr.substr(1, last_pos - 1) + ")";
			}
		}
		return buffer_expr + buffer_size_name_suffix + array_expr;
	}
}